

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void print_ir(FILE *io,uint depth,void *_ir)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  size_t sStack_50;
  uint local_3c;
  
  sVar1 = 2;
  local_3c = depth;
  do {
    if ((int *)_ir == (int *)0x0) {
      return;
    }
    pcVar5 = *(char **)((long)_ir + 8);
    pcVar2 = strrchr(pcVar5,0x2f);
    uVar6 = local_3c;
    if (pcVar2 == (char *)0x0) {
      pcVar3 = strrchr(pcVar5,0x5c);
      pcVar2 = pcVar3 + 1;
      if (pcVar3 == (char *)0x0) {
        pcVar2 = pcVar5;
      }
    }
    else {
      pcVar2 = pcVar2 + 1;
    }
    while (uVar6 != 0) {
      fwrite("  ",2,1,(FILE *)io);
      uVar6 = uVar6 - 1;
    }
    fprintf((FILE *)io,"[ %s:%d ",pcVar2,(ulong)*(uint *)((long)_ir + 0x10));
    if (0x15 < *_ir - 1U) {
switchD_0013140c_caseD_b:
      __assert_fail("0 && \"unexpected IR node\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x16bf,"void print_ir(FILE *, unsigned int, void *)");
    }
    local_3c = local_3c + 1;
    sStack_50 = sVar1;
    switch(*_ir) {
    case 1:
      fwrite("CONSTANT ",9,1,(FILE *)io);
      if (*(int *)((long)_ir + 0x18) - 4U < 5) {
        for (lVar7 = 0; lVar7 < (long)*(int *)((long)_ir + 0x1c) + -1; lVar7 = lVar7 + 1) {
          fprintf((FILE *)io,"%ff, ",(double)*(float *)((long)_ir + (lVar7 + 8) * 4));
        }
        if (0 < *(int *)((long)_ir + 0x1c)) {
          fprintf((FILE *)io,"%ff",(double)*(float *)((long)_ir + (lVar7 + 8) * 4));
        }
      }
      else {
        if (2 < *(int *)((long)_ir + 0x18) - 1U) {
          __assert_fail("0 && \"shouldn\'t happen\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1643,"void print_ir(FILE *, unsigned int, void *)");
        }
        for (lVar7 = 0; lVar7 < (long)*(int *)((long)_ir + 0x1c) + -1; lVar7 = lVar7 + 1) {
          fprintf((FILE *)io,"%d, ",(ulong)*(uint *)((long)_ir + (lVar7 + 8) * 4));
        }
        if (0 < *(int *)((long)_ir + 0x1c)) {
          fprintf((FILE *)io,"%d",(ulong)*(uint *)((long)_ir + (lVar7 + 8) * 4));
        }
      }
      pcVar5 = " ]\n";
      sStack_50 = 3;
LAB_001317e6:
      fwrite(pcVar5,sStack_50,1,(FILE *)io);
      return;
    case 2:
      uVar4 = (ulong)*(uint *)((long)_ir + 0x20);
      pcVar5 = "TEMP %d ]\n";
      goto LAB_00131754;
    case 3:
      fwrite("BINOP ",6,1,(FILE *)io);
      switch(*(int *)((long)_ir + 0x20)) {
      case 0:
        pcVar5 = "ADD";
        goto LAB_00131653;
      case 1:
        pcVar5 = "SUBTRACT";
        goto LAB_00131648;
      case 2:
        pcVar5 = "MULTIPLY";
LAB_00131648:
        sStack_50 = 8;
        break;
      case 3:
        pcVar5 = "DIVIDE";
        goto LAB_00131675;
      case 4:
        pcVar5 = "MODULO";
        goto LAB_00131675;
      case 5:
        pcVar5 = "AND";
        goto LAB_00131653;
      case 6:
        pcVar5 = "OR";
        break;
      case 7:
        pcVar5 = "XOR";
LAB_00131653:
        sStack_50 = 3;
        break;
      case 8:
        pcVar5 = "LSHIFT";
        goto LAB_00131675;
      case 9:
        pcVar5 = "RSHIFT";
LAB_00131675:
        sStack_50 = 6;
        break;
      case 10:
        pcVar5 = "UNKNOWN";
        sStack_50 = 7;
        break;
      default:
        __assert_fail("0 && \"unexpected case\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1674,"void print_ir(FILE *, unsigned int, void *)");
      }
      fwrite(pcVar5,sStack_50,1,(FILE *)io);
      fwrite(" ]\n",3,1,(FILE *)io);
      print_ir(io,local_3c,*(void **)((long)_ir + 0x28));
      sStack_50 = 0x30;
      goto LAB_001316aa;
    case 4:
      uVar4 = (ulong)*(uint *)((long)_ir + 0x20);
      pcVar5 = "MEMORY %d ]\n";
      goto LAB_00131754;
    case 5:
      fprintf((FILE *)io,"CALL %d ]\n",(ulong)*(uint *)((long)_ir + 0x20));
      goto LAB_00131602;
    case 6:
      pcVar5 = "ESEQ ]\n";
      sStack_50 = 7;
      break;
    case 7:
      fwrite("ARRAY ]\n",8,1,(FILE *)io);
      goto LAB_001315f2;
    case 8:
      pcVar5 = "CONVERT ]\n";
      sStack_50 = 10;
      break;
    case 9:
      fwrite("SWIZZLE",7,1,(FILE *)io);
      for (lVar7 = 0; lVar7 < (long)*(int *)((long)_ir + 0x1c) + -1; lVar7 = lVar7 + 1) {
        fprintf((FILE *)io," %d",(ulong)(uint)(int)*(char *)((long)_ir + lVar7 + 0x28));
      }
      pcVar5 = " ]\n";
      sStack_50 = 3;
      break;
    case 10:
      pcVar5 = "CONSTRUCT ]\n";
      sStack_50 = 0xc;
      break;
    default:
      goto switchD_0013140c_caseD_b;
    case 0xd:
      pcVar5 = "MOVE ]\n";
      sStack_50 = 7;
      goto LAB_0013157c;
    case 0xe:
      fwrite("EXPRSTMT ]\n",0xb,1,(FILE *)io);
      sStack_50 = 0x18;
      goto LAB_001316aa;
    case 0xf:
      uVar4 = (ulong)*(uint *)((long)_ir + 0x18);
      pcVar5 = "JUMP %d ]\n";
      goto LAB_00131754;
    case 0x10:
      fwrite("CJUMP ",6,1,(FILE *)io);
      switch(*(int *)((long)_ir + 0x18)) {
      case 0:
        pcVar5 = "EQL";
        break;
      case 1:
        pcVar5 = "NEQ";
        break;
      case 2:
        pcVar5 = "LT";
        goto LAB_001315d0;
      case 3:
        pcVar5 = "GT";
        goto LAB_001315d0;
      case 4:
        pcVar5 = "LEQ";
        break;
      case 5:
        pcVar5 = "GEQ";
        break;
      case 6:
        pcVar5 = "UNKNOWN";
        sStack_50 = 7;
        goto LAB_001315d0;
      default:
        __assert_fail("0 && \"unexpected case\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x16ac,"void print_ir(FILE *, unsigned int, void *)");
      }
      sStack_50 = 3;
LAB_001315d0:
      fwrite(pcVar5,sStack_50,1,(FILE *)io);
      fprintf((FILE *)io," %d %d ]\n",(ulong)*(uint *)((long)_ir + 0x30),
              (ulong)*(uint *)((long)_ir + 0x34));
LAB_001315f2:
      print_ir(io,local_3c,*(void **)((long)_ir + 0x20));
LAB_00131602:
      sStack_50 = 0x28;
      goto LAB_001316aa;
    case 0x11:
      pcVar5 = "SEQ ]\n";
      sStack_50 = 6;
      goto LAB_0013157c;
    case 0x12:
      uVar4 = (ulong)*(uint *)((long)_ir + 0x18);
      pcVar5 = "LABEL %d ]\n";
LAB_00131754:
      fprintf((FILE *)io,pcVar5,uVar4);
      return;
    case 0x13:
      pcVar5 = "DISCARD ]\n";
      sStack_50 = 10;
      goto LAB_001317e6;
    case 0x16:
      pcVar5 = "EXPRLIST ]\n";
      sStack_50 = 0xb;
LAB_0013157c:
      fwrite(pcVar5,sStack_50,1,(FILE *)io);
      print_ir(io,local_3c,*(void **)((long)_ir + 0x18));
      goto LAB_00131598;
    }
    fwrite(pcVar5,sStack_50,1,(FILE *)io);
LAB_00131598:
    sStack_50 = 0x20;
LAB_001316aa:
    _ir = *(void **)((long)_ir + sStack_50);
  } while( true );
}

Assistant:

static void print_ir(FILE *io, unsigned int depth, void *_ir)
{
    MOJOSHADER_irNode *ir = (MOJOSHADER_irNode *) _ir;
    if (ir == NULL)
        return;

    const char *fname = strrchr(ir->ir.filename, '/');
    if (fname != NULL)
        fname++;
    else
    {
        fname = strrchr(ir->ir.filename, '\\');
        if (fname != NULL)
            fname++;
        else
            fname = ir->ir.filename;
    } // else

    int i;
    for (i = 0; i < depth; i++)
        fprintf(io, "  ");
    depth++;

    fprintf(io, "[ %s:%d ", fname, ir->ir.line);

    switch (ir->ir.type)
    {
        case MOJOSHADER_IR_LABEL:
            fprintf(io, "LABEL %d ]\n", ir->stmt.label.index);
            break;

        case MOJOSHADER_IR_CONSTANT:
            fprintf(io, "CONSTANT ");
            switch (ir->expr.constant.info.type)
            {
                case MOJOSHADER_AST_DATATYPE_BOOL:
                case MOJOSHADER_AST_DATATYPE_INT:
                case MOJOSHADER_AST_DATATYPE_UINT:
                    for (i = 0; i < ir->expr.constant.info.elements-1; i++)
                        fprintf(io, "%d, ", ir->expr.constant.value.ival[i]);
                    if (ir->expr.constant.info.elements > 0)
                        fprintf(io, "%d", ir->expr.constant.value.ival[i]);
                    break;

                case MOJOSHADER_AST_DATATYPE_FLOAT:
                case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
                case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
                case MOJOSHADER_AST_DATATYPE_HALF:
                case MOJOSHADER_AST_DATATYPE_DOUBLE:
                    for (i = 0; i < ir->expr.constant.info.elements-1; i++)
                        fprintf(io, "%ff, ", ir->expr.constant.value.fval[i]);
                    if (ir->expr.constant.info.elements > 0)
                        fprintf(io, "%ff", ir->expr.constant.value.fval[i]);
                    break;

                default: assert(0 && "shouldn't happen");
            } // switch
            fprintf(io, " ]\n");
            break;

        case MOJOSHADER_IR_TEMP:
            fprintf(io, "TEMP %d ]\n", ir->expr.temp.index);
            break;

        case MOJOSHADER_IR_DISCARD:
            fprintf(io, "DISCARD ]\n");
            break;

        case MOJOSHADER_IR_SWIZZLE:
            fprintf(io, "SWIZZLE");
            for (i = 0; i < ir->expr.swizzle.info.elements-1; i++)
                fprintf(io, " %d", (int) ir->expr.swizzle.channels[i]);
            fprintf(io, " ]\n");
            print_ir(io, depth, ir->expr.swizzle.expr);
            break;

        case MOJOSHADER_IR_CONSTRUCT:
            fprintf(io, "CONSTRUCT ]\n");
            print_ir(io, depth, ir->expr.construct.args);
            break;

        case MOJOSHADER_IR_CONVERT:
            fprintf(io, "CONVERT ]\n");
            print_ir(io, depth, ir->expr.convert.expr);
            break;

        case MOJOSHADER_IR_BINOP:
            fprintf(io, "BINOP ");
            switch (ir->expr.binop.op)
            {
                #define PRINT_IR_BINOP(x) \
                    case MOJOSHADER_IR_BINOP_##x: fprintf(io, #x); break;
                PRINT_IR_BINOP(ADD)
                PRINT_IR_BINOP(SUBTRACT)
                PRINT_IR_BINOP(MULTIPLY)
                PRINT_IR_BINOP(DIVIDE)
                PRINT_IR_BINOP(MODULO)
                PRINT_IR_BINOP(AND)
                PRINT_IR_BINOP(OR)
                PRINT_IR_BINOP(XOR)
                PRINT_IR_BINOP(LSHIFT)
                PRINT_IR_BINOP(RSHIFT)
                PRINT_IR_BINOP(UNKNOWN)
                #undef PRINT_IR_BINOP
                default: assert(0 && "unexpected case"); break;
            } // switch
            fprintf(io, " ]\n");
            print_ir(io, depth, ir->expr.binop.left);
            print_ir(io, depth, ir->expr.binop.right);
            break;

        case MOJOSHADER_IR_MEMORY:
            fprintf(io, "MEMORY %d ]\n", ir->expr.memory.index);
            break;

        case MOJOSHADER_IR_CALL:
            fprintf(io, "CALL %d ]\n", ir->expr.call.index);
            print_ir(io, depth, ir->expr.call.args);
            break;

        case MOJOSHADER_IR_ESEQ:
            fprintf(io, "ESEQ ]\n");
            print_ir(io, depth, ir->expr.eseq.stmt);
            break;

        case MOJOSHADER_IR_ARRAY:
            fprintf(io, "ARRAY ]\n");
            print_ir(io, depth, ir->expr.array.array);
            print_ir(io, depth, ir->expr.array.element);
            break;

        case MOJOSHADER_IR_MOVE:
            fprintf(io, "MOVE ]\n");
            print_ir(io, depth, ir->stmt.move.dst);
            print_ir(io, depth, ir->stmt.move.src);
            break;

        case MOJOSHADER_IR_EXPR_STMT:
            fprintf(io, "EXPRSTMT ]\n");
            print_ir(io, depth, ir->stmt.expr.expr);
            break;

        case MOJOSHADER_IR_JUMP:
            fprintf(io, "JUMP %d ]\n", ir->stmt.jump.label);
            break;

        case MOJOSHADER_IR_CJUMP:
            fprintf(io, "CJUMP ");
            switch (ir->stmt.cjump.cond)
            {
                #define PRINT_IR_COND(x) \
                    case MOJOSHADER_IR_COND_##x: fprintf(io, #x); break;
                PRINT_IR_COND(EQL)
                PRINT_IR_COND(NEQ)
                PRINT_IR_COND(LT)
                PRINT_IR_COND(GT)
                PRINT_IR_COND(LEQ)
                PRINT_IR_COND(GEQ)
                PRINT_IR_COND(UNKNOWN)
                #undef PRINT_IR_COND
                default: assert(0 && "unexpected case"); break;
            } // switch
            fprintf(io, " %d %d ]\n", ir->stmt.cjump.iftrue, ir->stmt.cjump.iffalse);
            print_ir(io, depth, ir->stmt.cjump.left);
            print_ir(io, depth, ir->stmt.cjump.right);
            break;

        case MOJOSHADER_IR_SEQ:
            fprintf(io, "SEQ ]\n");
            print_ir(io, depth, ir->stmt.seq.first);
            print_ir(io, depth, ir->stmt.seq.next);  // !!! FIXME: don't recurse?
            break;

        case MOJOSHADER_IR_EXPRLIST:
            fprintf(io, "EXPRLIST ]\n");
            print_ir(io, depth, ir->misc.exprlist.expr);
            print_ir(io, depth, ir->misc.exprlist.next);  // !!! FIXME: don't recurse?
            break;

        default: assert(0 && "unexpected IR node"); break;
    } // switch
}